

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Socket.h
# Opt level: O3

int __thiscall axl::io::psx::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int __fd_00;
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  
  __fd_00 = (this->super_File).super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
            m_h;
  sVar2 = getSockAddrFamilySize((uint)((sockaddr *)CONCAT44(in_register_00000034,__fd))->sa_family);
  uVar1 = ::bind(__fd_00,(sockaddr *)CONCAT44(in_register_00000034,__fd),(socklen_t)sVar2);
  uVar3 = (ulong)uVar1;
  if (uVar1 == 0xffffffff) {
    uVar3 = err::setLastSystemError();
  }
  return (int)CONCAT71((int7)(uVar3 >> 8),uVar1 != 0xffffffff);
}

Assistant:

bool
	bind(const sockaddr* addr) {
		int result = ::bind(m_h, addr, getSockAddrSize(addr));
		return err::complete(result != -1);
	}